

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

void hexdump(char *title,uint8_t *p,size_t l)

{
  byte *pbVar1;
  long in_RDX;
  byte *in_RSI;
  undefined8 in_RDI;
  int i;
  int local_1c;
  long local_18;
  byte *local_10;
  
  fprintf(_stderr,"%s (%zu bytes):\n",in_RDI,in_RDX);
  local_18 = in_RDX;
  local_10 = in_RSI;
  do {
    if (local_18 == 0) {
      return;
    }
    fputs("   ",_stderr);
    for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
      pbVar1 = local_10 + 1;
      fprintf(_stderr," %02x",(ulong)*local_10);
      local_18 = local_18 + -1;
      local_10 = pbVar1;
      if (local_18 == 0) break;
    }
    fputc(10,_stderr);
  } while( true );
}

Assistant:

static void hexdump(const char *title, const uint8_t *p, size_t l)
{
    fprintf(stderr, "%s (%zu bytes):\n", title, l);

    while (l != 0) {
        int i;
        fputs("   ", stderr);
        for (i = 0; i < 16; ++i) {
            fprintf(stderr, " %02x", *p++);
            if (--l == 0)
                break;
        }
        fputc('\n', stderr);
    }
}